

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O1

Abc_Des_t * Abc_DesDupBlackboxes(Abc_Des_t *p,Abc_Ntk_t *pNtkSave)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Des_t *pAVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Ntk_t *pAVar6;
  int iVar7;
  long lVar8;
  
  if (p->vTops->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vTops) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLib.c"
                  ,0xaa,"Abc_Des_t *Abc_DesDupBlackboxes(Abc_Des_t *, Abc_Ntk_t *)");
  }
  if (p->vModules->nSize < 2) {
    __assert_fail("Vec_PtrSize(p->vModules) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLib.c"
                  ,0xab,"Abc_Des_t *Abc_DesDupBlackboxes(Abc_Des_t *, Abc_Ntk_t *)");
  }
  pAVar3 = Abc_DesCreate(p->pName);
  pVVar2 = pAVar3->vTops;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar4;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_001dd0f2;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar4;
    }
    pVVar2->nCap = iVar7;
  }
LAB_001dd0f2:
  iVar7 = pVVar2->nSize;
  pVVar2->nSize = iVar7 + 1;
  pVVar2->pArray[iVar7] = pNtkSave;
  pVVar2 = pAVar3->vModules;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar4;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_001dd17e;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar4;
    }
    pVVar2->nCap = iVar7;
  }
LAB_001dd17e:
  iVar7 = pVVar2->nSize;
  pVVar2->nSize = iVar7 + 1;
  pVVar2->pArray[iVar7] = pNtkSave;
  pVVar5 = p->vModules;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      if (((Abc_Ntk_t *)pVVar5->pArray[lVar8])->ntkFunc == ABC_FUNC_BLACKBOX) {
        pAVar6 = Abc_NtkDup((Abc_Ntk_t *)pVVar5->pArray[lVar8]);
        uVar1 = pVVar2->nCap;
        if (pVVar2->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
            }
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar1 * 2;
            if (iVar7 <= (int)uVar1) goto LAB_001dd21a;
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
            }
          }
          pVVar2->pArray = ppvVar4;
          pVVar2->nCap = iVar7;
        }
LAB_001dd21a:
        iVar7 = pVVar2->nSize;
        pVVar2->nSize = iVar7 + 1;
        pVVar2->pArray[iVar7] = pAVar6;
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vModules;
    } while (lVar8 < pVVar5->nSize);
  }
  return pAVar3;
}

Assistant:

Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave )
{
    Abc_Des_t * pNew;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Vec_PtrSize(p->vTops) > 0 );
    assert( Vec_PtrSize(p->vModules) > 1 );
    pNew = Abc_DesCreate( p->pName );
//    pNew->pManFunc = pNtkSave->pManFunc;
    Vec_PtrPush( pNew->vTops, pNtkSave );
    Vec_PtrPush( pNew->vModules, pNtkSave );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtkTemp, i )
        if ( Abc_NtkHasBlackbox( pNtkTemp ) )
            Vec_PtrPush( pNew->vModules, Abc_NtkDup(pNtkTemp) );
    return pNew;
}